

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::v5::internal::
     parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>&>
               (null_terminating_iterator<char> *it,
               width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
               *eh)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  undefined1 local_38 [8];
  null_terminating_iterator<char> next;
  uint big;
  uint max_int;
  uint value;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
  *eh_local;
  null_terminating_iterator<char> *it_local;
  
  cVar2 = null_terminating_iterator<char>::operator*(it);
  bVar1 = false;
  if ('/' < cVar2) {
    cVar2 = null_terminating_iterator<char>::operator*(it);
    bVar1 = cVar2 < ':';
  }
  if (!bVar1) {
    __assert_fail("\'0\' <= *it && *it <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format.h"
                  ,0x624,
                  "unsigned int fmt::internal::parse_nonnegative_int(Iterator &, ErrorHandler &&) [Iterator = fmt::internal::null_terminating_iterator<char>, ErrorHandler = fmt::internal::width_adapter<fmt::internal::specs_checker<fmt::internal::dynamic_specs_handler<fmt::basic_parse_context<char>>> &, char> &]"
                 );
  }
  big = 0;
  uVar3 = std::numeric_limits<int>::max();
  next.end_._4_4_ = uVar3 / 10;
  do {
    if (next.end_._4_4_ < big) {
      big = uVar3 + 1;
      break;
    }
    cVar2 = null_terminating_iterator<char>::operator*(it);
    big = big * 10 + cVar2 + -0x30;
    local_38 = (undefined1  [8])it->ptr_;
    next.ptr_ = it->end_;
    null_terminating_iterator<char>::operator++((null_terminating_iterator<char> *)local_38);
    it->ptr_ = (char *)local_38;
    it->end_ = next.ptr_;
    cVar2 = null_terminating_iterator<char>::operator*(it);
    bVar1 = false;
    if ('/' < cVar2) {
      cVar2 = null_terminating_iterator<char>::operator*(it);
      bVar1 = cVar2 < ':';
    }
  } while (bVar1);
  if (uVar3 < big) {
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
    ::on_error(eh,"number is too big");
  }
  return big;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(Iterator &it, ErrorHandler &&eh) {
  assert('0' <= *it && *it <= '9');
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*it - '0');
    // Workaround for MSVC "setup_exception stack overflow" error:
    auto next = it;
    ++next;
    it = next;
  } while ('0' <= *it && *it <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}